

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O0

char * lj_strfmt_wfnum(SBuf *sb,SFormat sf,lua_Number n,char *p)

{
  uint32_t uVar1;
  char cVar2;
  uint uVar3;
  MSize MVar4;
  int iVar5;
  MSize MVar6;
  double dVar7;
  uint uVar8;
  long lVar9;
  char *in_RDX;
  char *pcVar10;
  char *pcVar11;
  uint in_ESI;
  SBuf *in_RDI;
  bool bVar12;
  double in_XMM0_Qa;
  uint32_t maxprec_1;
  char tail_1 [9];
  uint32_t maxprec;
  char tail [9];
  int8_t *m_e;
  int32_t eidx;
  MSize hilen;
  int32_t nde;
  char eprefix_1;
  char *q_1;
  char prefix_2;
  int32_t ndebias;
  int32_t e_1;
  uint32_t i;
  uint32_t ndlo;
  uint32_t ndhi;
  uint32_t nd [64];
  char *q;
  uint32_t shift;
  char eprefix;
  char prefix_1;
  int32_t e;
  char *hexdig;
  int ch;
  int prefix;
  TValue t;
  MSize len;
  MSize prec;
  MSize width;
  MSize in_stack_fffffffffffffd7c;
  SBuf *in_stack_fffffffffffffd80;
  MSize in_stack_fffffffffffffd90;
  MSize in_stack_fffffffffffffd94;
  uint32_t *in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  byte local_245;
  uint local_244;
  uint local_234;
  int local_230;
  uint local_22c;
  char local_219 [9];
  uint local_210;
  char local_209 [9];
  uint8_t *local_200;
  int local_1f8;
  MSize local_1f4;
  uint32_t local_1f0;
  char local_1e9;
  char *local_1e8;
  char local_1dd;
  int local_1dc;
  uint local_1d8;
  uint32_t local_1d4;
  uint32_t local_1d0;
  uint32_t local_1cc;
  uint local_1c8 [31];
  uint local_14c;
  uint local_148;
  uint local_144;
  char *local_c0;
  int local_b4;
  char local_ae;
  char local_ad;
  uint32_t local_ac;
  char *local_a8;
  uint local_a0;
  int local_9c;
  undefined8 local_98;
  uint local_8c;
  uint local_88;
  uint local_84;
  char *local_80;
  double local_78;
  uint local_6c;
  SBuf *local_68;
  uint local_5c;
  SBuf *local_58;
  char *local_50;
  uint local_44;
  SBuf *local_40;
  char *local_38;
  uint local_2c;
  SBuf *local_28;
  char *local_20;
  uint local_14;
  char *local_8;
  
  local_84 = in_ESI >> 0x10 & 0xff;
  local_88 = (in_ESI >> 0x18) - 1;
  local_98._4_4_ = (uint)((ulong)in_XMM0_Qa >> 0x20);
  local_98._0_4_ = SUB84(in_XMM0_Qa,0);
  local_80 = in_RDX;
  local_6c = in_ESI;
  if (local_98._4_4_ << 1 < 0xffe00000) {
    local_68 = in_RDI;
    if ((in_ESI >> 4 & 3) == 0) {
      local_a8 = "0123456789abcdefpx";
      if ((in_ESI & 0x2000) != 0) {
        local_a8 = "0123456789ABCDEFPX";
      }
      uVar8 = local_98._4_4_ >> 0x14 & 0x7ff;
      local_ad = '\0';
      local_ae = '+';
      if (((ulong)in_XMM0_Qa & 0x8000000000000000) == 0) {
        if ((in_ESI & 0x200) == 0) {
          if ((in_ESI & 0x800) != 0) {
            local_ad = ' ';
          }
        }
        else {
          local_ad = '+';
        }
      }
      else {
        local_ad = '-';
      }
      local_98 = (double)((ulong)in_XMM0_Qa & 0xfffffffffffff);
      if (uVar8 == 0) {
        local_ac = 0;
        if ((uint)local_98 != 0 || local_98._4_4_ != 0) {
          if (local_98._4_4_ == 0) {
            local_230 = 0x1f;
            if ((uint)local_98 != 0) {
              for (; (uint)local_98 >> local_230 == 0; local_230 = local_230 + -1) {
              }
            }
            local_230 = 0x34 - local_230;
          }
          else {
            local_230 = 0x1f;
            if (local_98._4_4_ != 0) {
              for (; local_98._4_4_ >> local_230 == 0; local_230 = local_230 + -1) {
              }
            }
            local_230 = 0x14 - local_230;
          }
          local_b4 = local_230;
          local_ac = -local_230 - 0x3fe;
          local_98 = (double)((long)local_98 << ((byte)local_230 & 0x3f));
        }
      }
      else {
        local_98 = (double)((ulong)local_98 | 0x10000000000000);
        local_ac = uVar8 - 0x3ff;
      }
      if ((int)local_88 < 0) {
        if ((uint)local_98 == 0) {
          uVar8 = 0;
          for (uVar3 = local_98._4_4_ | 0x100000; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000)
          {
            uVar8 = uVar8 + 1;
          }
          local_234 = 5 - (uVar8 >> 2);
        }
        else {
          uVar8 = 0;
          for (uVar3 = (uint)local_98; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          local_234 = 0xd - (uVar8 >> 2);
        }
        local_88 = local_234;
      }
      else if (local_88 < 0xd) {
        local_98 = (double)((1L << ((char)local_88 * -4 + 0x33U & 0x3f)) + (long)local_98);
      }
      if ((int)local_ac < 0) {
        local_ae = '-';
        local_ac = -local_ac;
      }
      MVar4 = ndigits_dec(local_ac);
      local_8c = MVar4 + 5 + local_88 + (uint)(local_ad != '\0') +
                 (uint)(local_88 != 0 || (local_6c & 0x1000) != 0);
      if (local_80 == (char *)0x0) {
        local_244 = local_8c;
        if (local_8c < local_84) {
          local_244 = local_84;
        }
        local_28 = local_68;
        local_2c = local_244;
        if ((local_68->e).ptr32 - (local_68->p).ptr32 < local_244) {
          local_20 = lj_buf_more2(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
        }
        else {
          local_20 = (char *)(ulong)(local_68->p).ptr32;
        }
        local_80 = local_20;
      }
      if ((local_6c & 0x500) == 0) {
        while (uVar8 = local_84 - 1, bVar12 = local_8c < local_84, local_84 = uVar8, bVar12) {
          *local_80 = ' ';
          local_80 = local_80 + 1;
        }
      }
      if (local_ad != '\0') {
        *local_80 = local_ad;
        local_80 = local_80 + 1;
      }
      pcVar10 = local_80 + 1;
      *local_80 = '0';
      local_80 = local_80 + 2;
      *pcVar10 = local_a8[0x11];
      if ((local_6c & 0x500) == 0x400) {
        while (uVar8 = local_84 - 1, bVar12 = local_8c < local_84, local_84 = uVar8, bVar12) {
          *local_80 = '0';
          local_80 = local_80 + 1;
        }
      }
      pcVar11 = local_80 + 1;
      *local_80 = (char)(local_98._4_4_ >> 0x14) + '0';
      pcVar10 = pcVar11;
      if (local_88 != 0 || (local_6c & 0x1000) != 0) {
        local_c0 = local_80 + (ulong)local_88 + 2;
        *pcVar11 = '.';
        if (local_88 < 0xd) {
          local_98 = (double)((ulong)local_98 >> (0x34U - (char)(local_88 << 2) & 0x3f));
        }
        else {
          while (0xd < local_88) {
            pcVar11[local_88] = '0';
            local_88 = local_88 - 1;
          }
        }
        while (pcVar10 = local_c0, local_88 != 0) {
          pcVar11[local_88] = local_a8[(ulong)local_98 & 0xf];
          local_98 = (double)((ulong)local_98 >> 4);
          local_88 = local_88 - 1;
        }
      }
      local_80 = pcVar10;
      pcVar10 = local_80 + 1;
      *local_80 = local_a8[0x10];
      local_80 = local_80 + 2;
      *pcVar10 = local_ae;
      local_80 = lj_strfmt_wint(local_80,local_ac);
    }
    else {
      local_1d8 = local_98._4_4_ >> 0x14 & 0x7ff;
      local_1dc = 0;
      local_1dd = '\0';
      if (((ulong)in_XMM0_Qa & 0x8000000000000000) == 0) {
        if ((in_ESI & 0x200) == 0) {
          if ((in_ESI & 0x800) != 0) {
            local_1dd = ' ';
          }
        }
        else {
          local_1dd = '+';
        }
      }
      else {
        local_1dd = '-';
      }
      local_88 = ((int)local_88 >> 0x1f & 7U) + local_88;
      if ((in_ESI >> 4 & 3) == 3) {
        local_88 = (int)(local_88 - 1) >> 0x1f ^ local_88 - 1;
      }
      local_78 = in_XMM0_Qa;
      if ((((in_ESI & 0x10) != 0) && (local_88 < 0xe)) && ((in_XMM0_Qa != 0.0 || (NAN(in_XMM0_Qa))))
         ) {
        local_1dc = (int)rescale_e[(int)local_1d8 >> 6];
        if (local_1dc != 0) {
          local_98 = in_XMM0_Qa * rescale_n[(int)local_1d8 >> 6];
          if (local_1d8 == 0) {
            local_98 = local_98 * 10000000000.0;
            local_1dc = local_1dc + -10;
          }
          dVar7 = (double)((long)local_98 + -2);
          local_98._4_4_ = (uint)((ulong)dVar7 >> 0x20);
          local_1c8[0] = local_98._4_4_ & 0xfffff | 0x100000;
          local_1d8 = local_98._4_4_ >> 0x14 & 0x7ff;
          local_98 = dVar7;
          goto LAB_0012236a;
        }
      }
      while( true ) {
        local_98 = local_78;
        dVar7 = local_98;
        local_1cc = 0;
        local_98._4_4_ = (uint)((ulong)local_78 >> 0x20);
        local_1c8[0] = local_98._4_4_ & 0xfffff;
        if (local_1d8 == 0) {
          local_1d8 = 1;
        }
        else {
          local_1c8[0] = local_1c8[0] | 0x100000;
        }
        local_98._0_4_ = SUB84(local_78,0);
        bVar12 = (uint)local_98 != 0;
        uVar1 = local_1d8 - 0x413;
        local_98 = dVar7;
        if (bVar12) {
LAB_0012236a:
          local_1d8 = local_1d8 - 0x433;
          local_1cc = 0;
          local_1c8[0] = local_1c8[0] << 3 | (uint)local_98 >> 0x1d;
          local_1cc = nd_mul2k(local_1c8,0,0x1d,(uint)local_98 & 0x1fffffff,local_6c);
          uVar1 = local_1d8;
        }
        local_1d8 = uVar1;
        if ((int)local_1d8 < 0) {
          local_1d0 = nd_div2k(local_1c8,local_1cc,-local_1d8,local_6c);
          if ((local_1cc != 0) && (local_1c8[local_1cc] == 0)) {
            local_1cc = local_1cc - 1;
          }
        }
        else {
          local_1cc = nd_mul2k(local_1c8,local_1cc,local_1d8,0,local_6c);
          local_1d0 = 0;
        }
        if ((local_6c & 0x10) == 0) {
          if (local_88 < (-local_1d0 & 0x3f) * 9) {
            local_1cc = nd_add_m10e(local_1c8,local_1cc,'\x05',-1 - local_88);
          }
          goto LAB_00122e4f;
        }
        local_1e9 = '+';
        local_1f0 = -1;
        if ((local_1d0 != 0) && (local_1c8[local_1cc] == 0)) {
          local_1cc = 0x40;
          do {
            local_1cc = local_1cc - 1;
          } while (local_1c8[local_1cc] == 0);
          local_1f0 = -0x241;
        }
        local_1f4 = ndigits_dec(local_1c8[local_1cc]);
        local_1f0 = local_1cc * 9 + local_1f4 + local_1f0;
        if (local_1dc == 0) break;
        local_245 = 0;
        if (0xfffffffd < (uint)local_98) {
          local_245 = ((local_98._4_4_ ^ 0xffffffff) & 0xfffff) != 0 ^ 0xff;
        }
        local_1f8 = local_1d8 + 0x46 + (uint)(local_245 & 1);
        lVar9 = (long)(local_1f8 * 2);
        local_200 = (uint8_t *)(four_ulp_m_e + lVar9);
        local_144 = local_1c8[local_1cc];
        local_148 = local_1c8[local_1cc - 1 & 0x3f];
        local_14c = local_1c8[local_1cc - 2 & 0x3f];
        nd_add_m10e(local_1c8,local_1cc,four_ulp_m_e[lVar9],(int)four_ulp_m_e[lVar9 + 1]);
        iVar5 = nd_similar((uint32_t *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                           ,in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,
                           in_stack_fffffffffffffd94,in_stack_fffffffffffffd90);
        if (iVar5 != 0) break;
        local_1d8 = (uint)((ulong)local_78 >> 0x34) & 0x7ff;
        local_1dc = 0;
      }
      if (SBORROW4(local_88 - local_1f0,(-local_1d0 & 0x3f) * 9) !=
          (int)((local_88 - local_1f0) + (-local_1d0 & 0x3f) * -9) < 0) {
        local_1cc = nd_add_m10e(local_1c8,local_1cc,'\x05',(local_1f0 - local_88) + -1);
        MVar4 = local_1f4;
        MVar6 = ndigits_dec(local_1c8[local_1cc]);
        local_1f0 = (MVar4 != MVar6) + local_1f0;
      }
      local_1f0 = local_1dc + local_1f0;
      if ((local_6c & 0x20) != 0) {
        if (((int)local_1f0 <= (int)local_88) && (-5 < (int)local_1f0)) {
          if ((int)local_1f0 < 0) {
            local_1cc = 0;
          }
          local_88 = local_88 - local_1f0;
LAB_00122e4f:
          if (((((local_6c & 0x10) != 0) && ((local_6c & 0x1000) == 0)) && (local_88 != 0)) &&
             (local_84 != 0)) {
            if (local_1d0 == 0) {
              local_88 = 0;
            }
            else {
              uVar8 = (0x40 - local_1d0) * 9;
              if (local_88 < uVar8) {
                local_1d0 = 0x40 - (local_88 + 8) / 9;
              }
              else {
                local_88 = uVar8;
              }
              local_1d4 = local_88 + (0x3f - local_1d0) * -9;
              lj_strfmt_wuint9(local_219,local_1c8[local_1d0]);
              while( true ) {
                do {
                  bVar12 = false;
                  if (local_88 != 0) {
                    local_1d4 = local_1d4 - 1;
                    bVar12 = local_219[local_1d4] == '0';
                  }
                  if (!bVar12) goto LAB_00122fd9;
                  local_88 = local_88 - 1;
                } while (local_1d4 != 0);
                if (local_1d0 == 0x3f) break;
                local_1d0 = local_1d0 + 1;
                lj_strfmt_wuint9(local_219,local_1c8[local_1d0]);
                local_1d4 = 9;
              }
              local_88 = 0;
            }
          }
LAB_00122fd9:
          iVar5 = local_1cc * 9;
          MVar4 = ndigits_dec(local_1c8[local_1cc]);
          uVar8 = iVar5 + MVar4 + local_88 + (uint)(local_1dd != '\0') +
                  (uint)(local_88 != 0 || (local_6c & 0x1000) != 0);
          local_8c = uVar8;
          if (local_80 == (char *)0x0) {
            if (uVar8 < local_84) {
              uVar8 = local_84;
            }
            local_58 = local_68;
            local_5c = uVar8 + 8;
            if ((local_68->e).ptr32 - (local_68->p).ptr32 < uVar8 + 8) {
              local_50 = lj_buf_more2(local_68,uVar8);
            }
            else {
              local_50 = (char *)(ulong)(local_68->p).ptr32;
            }
            local_80 = local_50;
          }
          if ((local_6c & 0x500) == 0) {
            while (pcVar10 = local_80, uVar8 = local_84, local_84 = local_84 - 1, local_8c < uVar8)
            {
              local_80 = local_80 + 1;
              *pcVar10 = ' ';
            }
          }
          pcVar10 = local_80;
          if (local_1dd != '\0') {
            local_80 = local_80 + 1;
            *pcVar10 = local_1dd;
          }
          if ((local_6c & 0x500) == 0x400) {
            while (pcVar10 = local_80, uVar8 = local_84, local_84 = local_84 - 1, local_8c < uVar8)
            {
              local_80 = local_80 + 1;
              *pcVar10 = '0';
            }
          }
          local_80 = lj_strfmt_wint(local_80,local_1c8[local_1cc]);
          local_1d4 = local_1cc;
          while (pcVar10 = local_80, local_1d4 != 0) {
            local_1d4 = local_1d4 - 1;
            local_80 = lj_strfmt_wuint9(local_80,local_1c8[local_1d4]);
          }
          if (local_88 != 0 || (local_6c & 0x1000) != 0) {
            local_80 = local_80 + 1;
            *pcVar10 = '.';
            for (; 0 < (int)local_88 && local_1d4 != local_1d0; local_88 = local_88 - 9) {
              local_1d4 = local_1d4 - 1 & 0x3f;
              local_80 = lj_strfmt_wuint9(local_80,local_1c8[local_1d4]);
            }
            if (((local_6c & 0x10) == 0) || ((local_6c & 0x1000) != 0)) {
              for (; 0 < (int)local_88; local_88 = local_88 - 1) {
                *local_80 = '0';
                local_80 = local_80 + 1;
              }
              local_80 = local_80 + (int)local_88;
            }
            else {
              for (local_80 = local_80 + (int)(local_88 & (int)local_88 >> 0x1f);
                  local_80[-1] == '0'; local_80 = local_80 + -1) {
              }
              if (local_80[-1] == '.') {
                local_80 = local_80 + -1;
              }
            }
          }
          goto LAB_001233ee;
        }
        if ((((local_6c & 0x1000) == 0) && (local_88 != 0)) && (5 < local_84)) {
          local_210 = (local_1f4 - 1) + (local_1cc - local_1d0 & 0x3f) * 9;
          if (local_88 < local_210) {
            local_1d0 = local_1cc - (int)((local_88 - local_1f4) + 9) / 9 & 0x3f;
          }
          else {
            local_88 = local_210;
          }
          local_1d4 = (local_88 - local_1f4) + (local_1cc - local_1d0 & 0x3f) * -9 + 10;
          lj_strfmt_wuint9(local_209,local_1c8[local_1d0]);
          while( true ) {
            do {
              bVar12 = false;
              if (local_88 != 0) {
                local_1d4 = local_1d4 - 1;
                bVar12 = local_209[local_1d4] == '0';
              }
              if (!bVar12) goto LAB_00122905;
              local_88 = local_88 - 1;
            } while (local_1d4 != 0);
            if (local_1d0 == local_1cc) break;
            local_1d0 = local_1d0 + 1 & 0x3f;
            lj_strfmt_wuint9(local_209,local_1c8[local_1d0]);
            local_1d4 = 9;
          }
          local_88 = 0;
        }
      }
LAB_00122905:
      if ((int)local_1f0 < 0) {
        local_1e9 = '-';
        local_1f0 = -local_1f0;
      }
      iVar5 = local_88 + 3 + (uint)(local_1dd != '\0');
      MVar4 = ndigits_dec(local_1f0);
      uVar8 = iVar5 + MVar4 + (uint)((int)local_1f0 < 10) +
              (uint)(local_88 != 0 || (local_6c & 0x1000) != 0);
      local_8c = uVar8;
      if (local_80 == (char *)0x0) {
        if (uVar8 < local_84) {
          uVar8 = local_84;
        }
        local_40 = local_68;
        local_44 = uVar8 + 5;
        if ((local_68->e).ptr32 - (local_68->p).ptr32 < uVar8 + 5) {
          local_38 = lj_buf_more2(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
        }
        else {
          local_38 = (char *)(ulong)(local_68->p).ptr32;
        }
        local_80 = local_38;
      }
      if ((local_6c & 0x500) == 0) {
        while (pcVar10 = local_80, uVar8 = local_84, local_84 = local_84 - 1, local_8c < uVar8) {
          local_80 = local_80 + 1;
          *pcVar10 = ' ';
        }
      }
      pcVar10 = local_80;
      if (local_1dd != '\0') {
        local_80 = local_80 + 1;
        *pcVar10 = local_1dd;
      }
      if ((local_6c & 0x500) == 0x400) {
        while (pcVar10 = local_80, uVar8 = local_84, local_84 = local_84 - 1, local_8c < uVar8) {
          local_80 = local_80 + 1;
          *pcVar10 = '0';
        }
      }
      local_1e8 = lj_strfmt_wint(local_80 + 1,local_1c8[local_1cc]);
      *local_80 = local_80[1];
      if (local_88 == 0 && (local_6c & 0x1000) == 0) {
        local_80 = local_80 + 1;
      }
      else {
        local_80[1] = '.';
        iVar5 = (int)local_80;
        local_80 = local_1e8;
        local_1d4 = local_1cc;
        for (local_88 = local_88 - ((int)local_1e8 - (iVar5 + 2));
            0 < (int)local_88 && local_1d4 != local_1d0; local_88 = local_88 - 9) {
          local_1d4 = local_1d4 - 1 & 0x3f;
          local_80 = lj_strfmt_wuint9(local_80,local_1c8[local_1d4]);
        }
        if (((local_6c & 0x20) == 0) || ((local_6c & 0x1000) != 0)) {
          for (; 0 < (int)local_88; local_88 = local_88 - 1) {
            *local_80 = '0';
            local_80 = local_80 + 1;
          }
          local_80 = local_80 + (int)local_88;
        }
        else {
          for (local_80 = local_80 + (int)(local_88 & (int)local_88 >> 0x1f); local_80[-1] == '0';
              local_80 = local_80 + -1) {
          }
          if (local_80[-1] == '.') {
            local_80 = local_80 + -1;
          }
        }
      }
      cVar2 = 'e';
      if ((local_6c & 0x2000) != 0) {
        cVar2 = 'E';
      }
      *local_80 = cVar2;
      local_80[1] = local_1e9;
      pcVar10 = local_80 + 2;
      if ((int)local_1f0 < 10) {
        local_80[2] = '0';
        pcVar10 = local_80 + 3;
      }
      local_80 = pcVar10;
      local_80 = lj_strfmt_wint(local_80,local_1f0);
    }
  }
  else {
    local_9c = 0;
    local_a0 = 0;
    if ((in_ESI & 0x2000) != 0) {
      local_a0 = 0x202020;
    }
    if (((ulong)in_XMM0_Qa & 0xfffff00000000) == 0 && (uint)local_98 == 0) {
      local_a0 = local_a0 ^ 0x696e66;
      if (((ulong)in_XMM0_Qa & 0x8000000000000000) == 0) {
        if ((in_ESI & 0x200) == 0) {
          if ((in_ESI & 0x800) != 0) {
            local_9c = 0x20;
          }
        }
        else {
          local_9c = 0x2b;
        }
      }
      else {
        local_9c = 0x2d;
      }
    }
    else {
      local_a0 = local_a0 ^ 0x6e616e;
      if ((in_ESI & 0x800) != 0) {
        local_9c = 0x20;
      }
    }
    local_8c = (local_9c != 0) + 3;
    if (in_RDX == (char *)0x0) {
      local_22c = local_8c;
      if (local_8c < local_84) {
        local_22c = local_84;
      }
      local_14 = local_22c;
      if ((in_RDI->e).ptr32 - (in_RDI->p).ptr32 < local_22c) {
        local_8 = lj_buf_more2(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
      }
      else {
        local_8 = (char *)(ulong)(in_RDI->p).ptr32;
      }
      local_80 = local_8;
    }
    if ((local_6c & 0x100) == 0) {
      while (uVar8 = local_84 - 1, bVar12 = local_8c < local_84, local_84 = uVar8, bVar12) {
        *local_80 = ' ';
        local_80 = local_80 + 1;
      }
    }
    if (local_9c != 0) {
      *local_80 = (char)local_9c;
      local_80 = local_80 + 1;
    }
    *local_80 = (char)(local_a0 >> 0x10);
    pcVar10 = local_80 + 2;
    local_80[1] = (char)(local_a0 >> 8);
    local_80 = local_80 + 3;
    *pcVar10 = (char)local_a0;
  }
LAB_001233ee:
  if ((local_6c & 0x100) != 0) {
    while (local_8c < local_84) {
      *local_80 = ' ';
      local_84 = local_84 - 1;
      local_80 = local_80 + 1;
    }
  }
  return local_80;
}

Assistant:

static char *lj_strfmt_wfnum(SBuf *sb, SFormat sf, lua_Number n, char *p)
{
  MSize width = STRFMT_WIDTH(sf), prec = STRFMT_PREC(sf), len;
  TValue t;
  t.n = n;
  if (LJ_UNLIKELY((t.u32.hi << 1) >= 0xffe00000)) {
    /* Handle non-finite values uniformly for %a, %e, %f, %g. */
    int prefix = 0, ch = (sf & STRFMT_F_UPPER) ? 0x202020 : 0;
    if (((t.u32.hi & 0x000fffff) | t.u32.lo) != 0) {
      ch ^= ('n' << 16) | ('a' << 8) | 'n';
      if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    } else {
      ch ^= ('i' << 16) | ('n' << 8) | 'f';
      if ((t.u32.hi & 0x80000000)) prefix = '-';
      else if ((sf & STRFMT_F_PLUS)) prefix = '+';
      else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    }
    len = 3 + (prefix != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
    if (prefix) *p++ = prefix;
    *p++ = (char)(ch >> 16); *p++ = (char)(ch >> 8); *p++ = (char)ch;
  } else if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_A)) {
    /* %a */
    const char *hexdig = (sf & STRFMT_F_UPPER) ? "0123456789ABCDEFPX"
					       : "0123456789abcdefpx";
    int32_t e = (t.u32.hi >> 20) & 0x7ff;
    char prefix = 0, eprefix = '+';
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    t.u32.hi &= 0xfffff;
    if (e) {
      t.u32.hi |= 0x100000;
      e -= 1023;
    } else if (t.u32.lo | t.u32.hi) {
      /* Non-zero denormal - normalise it. */
      uint32_t shift = t.u32.hi ? 20-lj_fls(t.u32.hi) : 52-lj_fls(t.u32.lo);
      e = -1022 - shift;
      t.u64 <<= shift;
    }
    /* abs(n) == t.u64 * 2^(e - 52) */
    /* If n != 0, bit 52 of t.u64 is set, and is the highest set bit. */
    if ((int32_t)prec < 0) {
      /* Default precision: use smallest precision giving exact result. */
      prec = t.u32.lo ? 13-lj_ffs(t.u32.lo)/4 : 5-lj_ffs(t.u32.hi|0x100000)/4;
    } else if (prec < 13) {
      /* Precision is sufficiently low as to maybe require rounding. */
      t.u64 += (((uint64_t)1) << (51 - prec*4));
    }
    if (e < 0) {
      eprefix = '-';
      e = -e;
    }
    len = 5 + ndigits_dec((uint32_t)e) + prec + (prefix != 0)
	    + ((prec | (sf & STRFMT_F_ALT)) != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
      while (width-- > len) *p++ = ' ';
    }
    if (prefix) *p++ = prefix;
    *p++ = '0';
    *p++ = hexdig[17]; /* x or X */
    if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
      while (width-- > len) *p++ = '0';
    }
    *p++ = '0' + (t.u32.hi >> 20); /* Usually '1', sometimes '0' or '2'. */
    if ((prec | (sf & STRFMT_F_ALT))) {
      /* Emit fractional part. */
      char *q = p + 1 + prec;
      *p = '.';
      if (prec < 13) t.u64 >>= (52 - prec*4);
      else while (prec > 13) p[prec--] = '0';
      while (prec) { p[prec--] = hexdig[t.u64 & 15]; t.u64 >>= 4; }
      p = q;
    }
    *p++ = hexdig[16]; /* p or P */
    *p++ = eprefix; /* + or - */
    p = lj_strfmt_wint(p, e);
  } else {
    /* %e or %f or %g - begin by converting n to "nd" format. */
    uint32_t nd[64];
    uint32_t ndhi = 0, ndlo, i;
    int32_t e = (t.u32.hi >> 20) & 0x7ff, ndebias = 0;
    char prefix = 0, *q;
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    prec += ((int32_t)prec >> 31) & 7; /* Default precision is 6. */
    if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_G)) {
      /* %g - decrement precision if non-zero (to make it like %e). */
      prec--;
      prec ^= (uint32_t)((int32_t)prec >> 31);
    }
    if ((sf & STRFMT_T_FP_E) && prec < 14 && n != 0) {
      /* Precision is sufficiently low that rescaling will probably work. */
      if ((ndebias = rescale_e[e >> 6])) {
	t.n = n * rescale_n[e >> 6];
	if (LJ_UNLIKELY(!e)) t.n *= 1e10, ndebias -= 10;
	t.u64 -= 2; /* Convert 2ulp below (later we convert 2ulp above). */
	nd[0] = 0x100000 | (t.u32.hi & 0xfffff);
	e = ((t.u32.hi >> 20) & 0x7ff) - 1075 - (ND_MUL2K_MAX_SHIFT < 29);
	goto load_t_lo; rescale_failed:
	t.n = n;
	e = (t.u32.hi >> 20) & 0x7ff;
	ndebias = ndhi = 0;
      }
    }
    nd[0] = t.u32.hi & 0xfffff;
    if (e == 0) e++; else nd[0] |= 0x100000;
    e -= 1043;
    if (t.u32.lo) {
      e -= 32 + (ND_MUL2K_MAX_SHIFT < 29); load_t_lo:
#if ND_MUL2K_MAX_SHIFT >= 29
      nd[0] = (nd[0] << 3) | (t.u32.lo >> 29);
      ndhi = nd_mul2k(nd, ndhi, 29, t.u32.lo & 0x1fffffff, sf);
#elif ND_MUL2K_MAX_SHIFT >= 11
      ndhi = nd_mul2k(nd, ndhi, 11, t.u32.lo >> 21, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo >> 10) & 0x7ff, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo <<  1) & 0x7ff, sf);
#else
#error "ND_MUL2K_MAX_SHIFT too small"
#endif
    }
    if (e >= 0) {
      ndhi = nd_mul2k(nd, ndhi, (uint32_t)e, 0, sf);
      ndlo = 0;
    } else {
      ndlo = nd_div2k(nd, ndhi, (uint32_t)-e, sf);
      if (ndhi && !nd[ndhi]) ndhi--;
    }
    /* abs(n) == nd * 10^ndebias (for slightly loose interpretation of ==) */
    if ((sf & STRFMT_T_FP_E)) {
      /* %e or %g - assume %e and start by calculating nd's exponent (nde). */
      char eprefix = '+';
      int32_t nde = -1;
      MSize hilen;
      if (ndlo && !nd[ndhi]) {
	ndhi = 64; do {} while (!nd[--ndhi]);
	nde -= 64 * 9;
      }
      hilen = ndigits_dec(nd[ndhi]);
      nde += ndhi * 9 + hilen;
      if (ndebias) {
	/*
	** Rescaling was performed, but this introduced some error, and might
	** have pushed us across a rounding boundary. We check whether this
	** error affected the result by introducing even more error (2ulp in
	** either direction), and seeing whether a rounding boundary was
	** crossed. Having already converted the -2ulp case, we save off its
	** most significant digits, convert the +2ulp case, and compare them.
	*/
	int32_t eidx = e + 70 + (ND_MUL2K_MAX_SHIFT < 29)
			 + (t.u32.lo >= 0xfffffffe && !(~t.u32.hi << 12));
	const int8_t *m_e = four_ulp_m_e + eidx * 2;
	lj_assertG_(G(sbufL(sb)), 0 <= eidx && eidx < 128, "bad eidx %d", eidx);
	nd[33] = nd[ndhi];
	nd[32] = nd[(ndhi - 1) & 0x3f];
	nd[31] = nd[(ndhi - 2) & 0x3f];
	nd_add_m10e(nd, ndhi, (uint8_t)*m_e, m_e[1]);
	if (LJ_UNLIKELY(!nd_similar(nd, ndhi, nd + 33, hilen, prec + 1))) {
	  goto rescale_failed;
	}
      }
      if ((int32_t)(prec - nde) < (0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, nde - prec - 1);
	nde += (hilen != ndigits_dec(nd[ndhi]));
      }
      nde += ndebias;
      if ((sf & STRFMT_T_FP_F)) {
	/* %g */
	if ((int32_t)prec >= nde && nde >= -4) {
	  if (nde < 0) ndhi = 0;
	  prec -= nde;
	  goto g_format_like_f;
	} else if (!(sf & STRFMT_F_ALT) && prec && width > 5) {
	  /* Decrease precision in order to strip trailing zeroes. */
	  char tail[9];
	  uint32_t maxprec = hilen - 1 + ((ndhi - ndlo) & 0x3f) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = (ndhi - (((int32_t)(prec - hilen) + 9) / 9)) & 0x3f;
	  i = prec - hilen - (((ndhi - ndlo) & 0x3f) * 9) + 10;
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == ndhi) { prec = 0; break; }
	      ndlo = (ndlo + 1) & 0x3f;
	      lj_strfmt_wuint9(tail, nd[ndlo]);
	      i = 9;
	    }
	  }
	}
      }
      if (nde < 0) {
	/* Make nde non-negative. */
	eprefix = '-';
	nde = -nde;
      }
      len = 3 + prec + (prefix != 0) + ndigits_dec((uint32_t)nde) + (nde < 10)
	      + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 5);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      q = lj_strfmt_wint(p + 1, nd[ndhi]);
      p[0] = p[1]; /* Put leading digit in the correct place. */
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	p[1] = '.'; p += 2;
	prec -= (MSize)(q - p); p = q; /* Account for digits already emitted. */
	/* Then emit chunks of 9 digits (this may emit 8 digits too many). */
	for (i = ndhi; (int32_t)prec > 0 && i != ndlo; prec -= 9) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	}
	if ((sf & STRFMT_T_FP_F) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %e (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      } else {
	p++;
      }
      *p++ = (sf & STRFMT_F_UPPER) ? 'E' : 'e';
      *p++ = eprefix; /* + or - */
      if (nde < 10) *p++ = '0'; /* Always at least two digits of exponent. */
      p = lj_strfmt_wint(p, nde);
    } else {
      /* %f (or, shortly, %g in %f style) */
      if (prec < (MSize)(0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, 0 - prec - 1);
      }
      g_format_like_f:
      if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT) && prec && width) {
	/* Decrease precision in order to strip trailing zeroes. */
	if (ndlo) {
	  /* nd has a fractional part; we need to look at its digits. */
	  char tail[9];
	  uint32_t maxprec = (64 - ndlo) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = 64 - (prec + 8) / 9;
	  i = prec - ((63 - ndlo) * 9);
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == 63) { prec = 0; break; }
	      lj_strfmt_wuint9(tail, nd[++ndlo]);
	      i = 9;
	    }
	  }
	} else {
	  /* nd has no fractional part, so precision goes straight to zero. */
	  prec = 0;
	}
      }
      len = ndhi * 9 + ndigits_dec(nd[ndhi]) + prec + (prefix != 0)
		     + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 8);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      /* Emit integer part. */
      p = lj_strfmt_wint(p, nd[ndhi]);
      i = ndhi;
      while (i) p = lj_strfmt_wuint9(p, nd[--i]);
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	*p++ = '.';
	/* Emit chunks of 9 digits (this may emit 8 digits too many). */
	while ((int32_t)prec > 0 && i != ndlo) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	  prec -= 9;
	}
	if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %f (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      }
    }
  }
  if ((sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
  return p;
}